

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

StringRef llvm::yaml::ScalarTraits<llvm::yaml::Hex8,_void>::input
                    (StringRef Scalar,void *param_2,Hex8 *Val)

{
  bool bVar1;
  unsigned_long_long *in_R8;
  StringRef Str;
  uint8_t local_51;
  llvm *local_50;
  char *local_48;
  ulong local_40;
  unsigned_long_long n;
  Hex8 *Val_local;
  void *param_1_local;
  StringRef Scalar_local;
  
  Str.Data = (char *)Scalar.Length;
  local_50 = (llvm *)Scalar.Data;
  Str.Length = 0;
  local_48 = Str.Data;
  n = (unsigned_long_long)Val;
  Val_local = (Hex8 *)param_2;
  param_1_local = local_50;
  Scalar_local.Data = Str.Data;
  bVar1 = getAsUnsignedInteger(local_50,Str,(uint)&local_40,in_R8);
  if (bVar1) {
    StringRef::StringRef((StringRef *)&Scalar_local.Length,"invalid hex8 number");
  }
  else if (local_40 < 0x100) {
    local_51 = (uint8_t)local_40;
    Hex8::operator=((Hex8 *)n,&local_51);
    memset(&Scalar_local.Length,0,0x10);
    StringRef::StringRef((StringRef *)&Scalar_local.Length);
  }
  else {
    StringRef::StringRef((StringRef *)&Scalar_local.Length,"out of range hex8 number");
  }
  return stack0xffffffffffffffe8;
}

Assistant:

StringRef ScalarTraits<Hex8>::input(StringRef Scalar, void *, Hex8 &Val) {
  unsigned long long n;
  if (getAsUnsignedInteger(Scalar, 0, n))
    return "invalid hex8 number";
  if (n > 0xFF)
    return "out of range hex8 number";
  Val = n;
  return StringRef();
}